

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::SyntaxNode> *args_1;
  RsCodeBlockSyntax *pRVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::SyntaxNode>
                     ((SyntaxList<slang::syntax::SyntaxNode> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsCodeBlockSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsCodeBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsCodeBlockSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}